

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmSat.c
# Opt level: O0

word Sfm_ComputeInterpolant(Sfm_Ntk_t *p)

{
  Vec_Int_t *pVVar1;
  sat_solver *psVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  int *piVar7;
  word *p_00;
  ulong local_b8;
  int local_5c;
  int nVars;
  int pLits [2];
  int nIter;
  int *pFinal;
  int nFinal;
  int iVar;
  int Div;
  int i;
  int status;
  word uTruth;
  word uCube;
  word *pSign;
  Sfm_Ntk_t *p_local;
  
  _i = 0;
  pLits[0] = 0;
  iVar3 = sat_solver_nvars(p->pSat);
  sat_solver_setnvars(p->pSat,iVar3 + 1);
  iVar4 = Sfm_ObjSatVar(p,p->iPivotNode);
  local_5c = Abc_Var2Lit(iVar4,0);
  nVars = Abc_Var2Lit(iVar3,0);
  iVar3 = Vec_IntSize(p->vDivIds);
  if (6 < iVar3) {
    __assert_fail("Vec_IntSize(p->vDivIds) <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmSat.c"
                  ,0xaa,"word Sfm_ComputeInterpolant(Sfm_Ntk_t *)");
  }
  while( true ) {
    p->nSatCalls = p->nSatCalls + 1;
    iVar3 = sat_solver_solve(p->pSat,&local_5c,pLits,(long)p->pPars->nBTLimit,0,0,0);
    if (iVar3 == 0) {
      return 0x1234567812345678;
    }
    if (iVar3 == -1) {
      return _i;
    }
    if (iVar3 != 1) {
      __assert_fail("status == l_True",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmSat.c"
                    ,0xb4,"word Sfm_ComputeInterpolant(Sfm_Ntk_t *)");
    }
    Vec_IntClear(p->vValues);
    for (iVar = 0; iVar3 = Vec_IntSize(p->vDivVars), iVar < iVar3; iVar = iVar + 1) {
      iVar3 = Vec_IntEntry(p->vDivVars,iVar);
      pVVar1 = p->vValues;
      iVar3 = sat_solver_var_value(p->pSat,iVar3);
      Vec_IntPush(pVVar1,iVar3);
    }
    Vec_IntClear(p->vLits);
    pVVar1 = p->vLits;
    iVar3 = Abc_LitNot(local_5c);
    Vec_IntPush(pVVar1,iVar3);
    for (iVar = 0; iVar3 = Vec_IntSize(p->vDivIds), iVar < iVar3; iVar = iVar + 1) {
      iVar3 = Vec_IntEntry(p->vDivIds,iVar);
      pVVar1 = p->vLits;
      iVar3 = sat_solver_var_literal(p->pSat,iVar3);
      Vec_IntPush(pVVar1,iVar3);
    }
    p->nSatCalls = p->nSatCalls + 1;
    psVar2 = p->pSat;
    piVar6 = Vec_IntArray(p->vLits);
    piVar7 = Vec_IntArray(p->vLits);
    iVar3 = Vec_IntSize(p->vLits);
    iVar3 = sat_solver_solve(psVar2,piVar6,piVar7 + iVar3,(long)p->pPars->nBTLimit,0,0,0);
    if (iVar3 == 0) {
      return 0x1234567812345678;
    }
    if (iVar3 == 1) {
      iVar = 0;
      do {
        iVar3 = Vec_IntSize(p->vDivVars);
        if (iVar3 <= iVar) {
          p->nCexes = p->nCexes + 1;
          return 0x8765432187654321;
        }
        iVar3 = Vec_IntEntry(p->vDivVars,iVar);
        iVar4 = Vec_IntEntry(p->vValues,iVar);
        iVar3 = sat_solver_var_value(p->pSat,iVar3);
        if (iVar4 != iVar3) {
          p_00 = Vec_WrdEntryP(p->vDivCexes,iVar);
          iVar3 = Abc_InfoHasBit((uint *)p_00,p->nCexes);
          if (iVar3 != 0) {
            __assert_fail("!Abc_InfoHasBit( (unsigned *)pSign, p->nCexes)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmSat.c"
                          ,0xde,"word Sfm_ComputeInterpolant(Sfm_Ntk_t *)");
          }
          Abc_InfoXorBit((uint *)p_00,p->nCexes);
        }
        iVar = iVar + 1;
      } while( true );
    }
    if (iVar3 != -1) {
      __assert_fail("status == l_False",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmSat.c"
                    ,0xc5,"word Sfm_ComputeInterpolant(Sfm_Ntk_t *)");
    }
    iVar3 = sat_solver_final(p->pSat,(int **)(pLits + 1));
    uTruth = 0xffffffffffffffff;
    Vec_IntClear(p->vLits);
    pVVar1 = p->vLits;
    iVar4 = Abc_LitNot(nVars);
    Vec_IntPush(pVVar1,iVar4);
    for (iVar = 0; iVar < iVar3; iVar = iVar + 1) {
      if (*(int *)(stack0xffffffffffffffb0 + (long)iVar * 4) != local_5c) {
        Vec_IntPush(p->vLits,*(int *)(stack0xffffffffffffffb0 + (long)iVar * 4));
        pVVar1 = p->vDivIds;
        iVar4 = Abc_Lit2Var(*(int *)(stack0xffffffffffffffb0 + (long)iVar * 4));
        iVar4 = Vec_IntFind(pVVar1,iVar4);
        if (iVar4 < 0) {
          __assert_fail("iVar >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmSat.c"
                        ,0xd0,"word Sfm_ComputeInterpolant(Sfm_Ntk_t *)");
        }
        iVar5 = Abc_LitIsCompl(*(int *)(stack0xffffffffffffffb0 + (long)iVar * 4));
        if (iVar5 == 0) {
          local_b8 = s_Truths6[iVar4] ^ 0xffffffffffffffff;
        }
        else {
          local_b8 = s_Truths6[iVar4];
        }
        uTruth = local_b8 & uTruth;
      }
    }
    _i = uTruth | _i;
    psVar2 = p->pSat;
    piVar6 = Vec_IntArray(p->vLits);
    piVar7 = Vec_IntArray(p->vLits);
    iVar3 = Vec_IntSize(p->vLits);
    iVar3 = sat_solver_addclause(psVar2,piVar6,piVar7 + iVar3);
    if (iVar3 == 0) break;
    pLits[0] = pLits[0] + 1;
  }
  __assert_fail("status",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmSat.c"
                ,0xd5,"word Sfm_ComputeInterpolant(Sfm_Ntk_t *)");
}

Assistant:

word Sfm_ComputeInterpolant( Sfm_Ntk_t * p )
{
    word * pSign, uCube, uTruth = 0;
    int status, i, Div, iVar, nFinal, * pFinal, nIter = 0;
    int pLits[2], nVars = sat_solver_nvars( p->pSat );
    sat_solver_setnvars( p->pSat, nVars + 1 );
    pLits[0] = Abc_Var2Lit( Sfm_ObjSatVar(p, p->iPivotNode), 0 ); // F = 1
    pLits[1] = Abc_Var2Lit( nVars, 0 ); // iNewLit
    assert( Vec_IntSize(p->vDivIds) <= 6 );
    while ( 1 ) 
    {
        // find onset minterm
        p->nSatCalls++;
        status = sat_solver_solve( p->pSat, pLits, pLits + 2, p->pPars->nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            return SFM_SAT_UNDEC;
        if ( status == l_False )
            return uTruth;
        assert( status == l_True );
        // remember variable values
        Vec_IntClear( p->vValues );
        Vec_IntForEachEntry( p->vDivVars, iVar, i )
            Vec_IntPush( p->vValues, sat_solver_var_value(p->pSat, iVar) );
        // collect divisor literals
        Vec_IntClear( p->vLits );
        Vec_IntPush( p->vLits, Abc_LitNot(pLits[0]) ); // F = 0
        Vec_IntForEachEntry( p->vDivIds, Div, i )
            Vec_IntPush( p->vLits, sat_solver_var_literal(p->pSat, Div) );
        // check against offset
        p->nSatCalls++;
        status = sat_solver_solve( p->pSat, Vec_IntArray(p->vLits), Vec_IntArray(p->vLits) + Vec_IntSize(p->vLits), p->pPars->nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            return SFM_SAT_UNDEC;
        if ( status == l_True )
            break;
        assert( status == l_False );
        // compute cube and add clause
        nFinal = sat_solver_final( p->pSat, &pFinal );
        uCube = ~(word)0;
        Vec_IntClear( p->vLits );
        Vec_IntPush( p->vLits, Abc_LitNot(pLits[1]) ); // NOT(iNewLit)
        for ( i = 0; i < nFinal; i++ )
        {
            if ( pFinal[i] == pLits[0] )
                continue;
            Vec_IntPush( p->vLits, pFinal[i] );
            iVar = Vec_IntFind( p->vDivIds, Abc_Lit2Var(pFinal[i]) );   assert( iVar >= 0 );
            uCube &= Abc_LitIsCompl(pFinal[i]) ? s_Truths6[iVar] : ~s_Truths6[iVar];
        }
        uTruth |= uCube;
        status = sat_solver_addclause( p->pSat, Vec_IntArray(p->vLits), Vec_IntArray(p->vLits) + Vec_IntSize(p->vLits) );
        assert( status );
        nIter++;
    }
    assert( status == l_True );
    // store the counter-example
    Vec_IntForEachEntry( p->vDivVars, iVar, i )
        if ( Vec_IntEntry(p->vValues, i) ^ sat_solver_var_value(p->pSat, iVar) ) // insert 1
        {
            pSign = Vec_WrdEntryP( p->vDivCexes, i );
            assert( !Abc_InfoHasBit( (unsigned *)pSign, p->nCexes) );
            Abc_InfoXorBit( (unsigned *)pSign, p->nCexes );
        }
    p->nCexes++;
    return SFM_SAT_SAT;
}